

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CustomHeap.cpp
# Opt level: O0

BOOL __thiscall
Memory::CustomHeap::Heap<Memory::VirtualAllocWrapper,_Memory::PreReservedVirtualAllocWrapper>::
ProtectAllocation(Heap<Memory::VirtualAllocWrapper,_Memory::PreReservedVirtualAllocWrapper> *this,
                 Allocation *allocation,DWORD dwVirtualProtectFlags,DWORD desiredOldProtectFlag,
                 char *addressInPage)

{
  void *pvVar1;
  char *address_00;
  code *pcVar2;
  bool bVar3;
  undefined4 *puVar4;
  size_t page;
  void *segment;
  size_t pageCount;
  char *address;
  char *addressInPage_local;
  DWORD desiredOldProtectFlag_local;
  DWORD dwVirtualProtectFlags_local;
  Allocation *allocation_local;
  Heap<Memory::VirtualAllocWrapper,_Memory::PreReservedVirtualAllocWrapper> *this_local;
  
  if (allocation == (Allocation *)0x0) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar4 = 1;
    bVar3 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/CustomHeap.cpp"
                       ,0x14f,"(allocation != nullptr)","allocation != nullptr");
    if (!bVar3) {
      pcVar2 = (code *)invalidInstructionException();
      (*pcVar2)();
    }
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar4 = 0;
  }
  if ((allocation->field_0x28 & 1) == 0) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar4 = 1;
    bVar3 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/CustomHeap.cpp"
                       ,0x150,"(allocation->isAllocationUsed)","allocation->isAllocationUsed");
    if (!bVar3) {
      pcVar2 = (code *)invalidInstructionException();
      (*pcVar2)();
    }
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar4 = 0;
  }
  if ((addressInPage != (char *)0x0) &&
     ((addressInPage < allocation->address ||
      (allocation->address + allocation->size <= addressInPage)))) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar4 = 1;
    bVar3 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/CustomHeap.cpp"
                       ,0x151,
                       "(addressInPage == nullptr || (addressInPage >= allocation->address && addressInPage < (allocation->address + allocation->size)))"
                       ,
                       "addressInPage == nullptr || (addressInPage >= allocation->address && addressInPage < (allocation->address + allocation->size))"
                      );
    if (!bVar3) {
      pcVar2 = (code *)invalidInstructionException();
      (*pcVar2)();
    }
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar4 = 0;
  }
  pageCount = (size_t)allocation->address;
  bVar3 = Allocation::IsLargeAllocation(allocation);
  if (bVar3) {
    bVar3 = Js::ConfigFlagsTable::IsEnabled
                      ((ConfigFlagsTable *)&Js::Configuration::Global,TraceProtectPagesFlag);
    if (bVar3) {
      Output::Print(L"Protecting large allocation\n");
    }
    pvVar1 = (allocation->field_0).largeObjectAllocation.segment;
    if (addressInPage == (char *)0x0) {
      segment = (void *)Allocation::GetPageCount(allocation);
    }
    else {
      if (allocation->address + 0x1000 <= addressInPage) {
        pageCount = (size_t)(allocation->address +
                            (((long)addressInPage - (long)allocation->address) / 0x1000) * 0x1000);
      }
      segment = &DAT_00000001;
    }
    if ((DAT_01ec73ca & 1) != 0) {
      Output::Trace(CustomHeapPhase,L"Protecting 0x%p with 0x%x\n",pageCount,
                    (ulong)dwVirtualProtectFlags);
    }
    this_local._4_4_ =
         CodePageAllocators<Memory::VirtualAllocWrapper,_Memory::PreReservedVirtualAllocWrapper>::
         ProtectPages(this->codePageAllocators,(char *)pageCount,(size_t)segment,pvVar1,
                      dwVirtualProtectFlags,desiredOldProtectFlag);
  }
  else {
    bVar3 = Js::ConfigFlagsTable::IsEnabled
                      ((ConfigFlagsTable *)&Js::Configuration::Global,TraceProtectPagesFlag);
    if (bVar3) {
      Output::Print(L"Protecting small allocation\n");
    }
    pvVar1 = ((allocation->field_0).page)->segment;
    address_00 = ((allocation->field_0).page)->address;
    if ((DAT_01ec73ca & 1) != 0) {
      Output::Trace(CustomHeapPhase,L"Protecting 0x%p with 0x%x\n",address_00,
                    (ulong)dwVirtualProtectFlags);
    }
    this_local._4_4_ =
         CodePageAllocators<Memory::VirtualAllocWrapper,_Memory::PreReservedVirtualAllocWrapper>::
         ProtectPages(this->codePageAllocators,address_00,1,pvVar1,dwVirtualProtectFlags,
                      desiredOldProtectFlag);
  }
  return this_local._4_4_;
}

Assistant:

BOOL Heap<TAlloc, TPreReservedAlloc>::ProtectAllocation(__in Allocation* allocation, DWORD dwVirtualProtectFlags, DWORD desiredOldProtectFlag, __in_opt char* addressInPage)
{
    // Allocate at the page level so that our protections don't
    // transcend allocation page boundaries. Here, allocation->address is page
    // aligned if the object is a large object allocation. If it isn't, in the else
    // branch of the following if statement, we set it to the allocation's page's
    // address. This ensures that the address being protected is always page aligned

    Assert(allocation != nullptr);
    Assert(allocation->isAllocationUsed);
    Assert(addressInPage == nullptr || (addressInPage >= allocation->address && addressInPage < (allocation->address + allocation->size)));

    char* address = allocation->address;

    size_t pageCount;
    void * segment;
    if (allocation->IsLargeAllocation())
    {
#if DBG_DUMP || defined(RECYCLER_TRACE)
        if (Js::Configuration::Global.flags.IsEnabled(Js::TraceProtectPagesFlag))
        {
            Output::Print(_u("Protecting large allocation\n"));
        }
#endif
        segment = allocation->largeObjectAllocation.segment;

        if (addressInPage != nullptr)
        {
            if (addressInPage >= allocation->address + AutoSystemInfo::PageSize)
            {
                size_t page = (addressInPage - allocation->address) / AutoSystemInfo::PageSize;

                address = allocation->address + (page * AutoSystemInfo::PageSize);
            }
            pageCount = 1;
        }
        else
        {
            pageCount = allocation->GetPageCount();
        }

        VerboseHeapTrace(_u("Protecting 0x%p with 0x%x\n"), address, dwVirtualProtectFlags);
        return this->codePageAllocators->ProtectPages(address, pageCount, segment, dwVirtualProtectFlags, desiredOldProtectFlag);
    }
    else
    {
#if DBG_DUMP || defined(RECYCLER_TRACE)
        if (Js::Configuration::Global.flags.IsEnabled(Js::TraceProtectPagesFlag))
        {
            Output::Print(_u("Protecting small allocation\n"));
        }
#endif
        segment = allocation->page->segment;
        address = allocation->page->address;
        pageCount = 1;

        VerboseHeapTrace(_u("Protecting 0x%p with 0x%x\n"), address, dwVirtualProtectFlags);
        return this->codePageAllocators->ProtectPages(address, pageCount, segment, dwVirtualProtectFlags, desiredOldProtectFlag);
    }
}